

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O2

double StrToD16(uc16 *str16,int length,int flags,double empty_string_value,
               int *processed_characters_count,bool *processed_all,uc16 separator)

{
  double dVar1;
  StringToDoubleConverter local_48;
  
  local_48.junk_string_value_ = NAN;
  local_48.infinity_symbol_ = (char *)0x0;
  local_48.nan_symbol_ = (char *)0x0;
  local_48.flags_ = flags;
  local_48.empty_string_value_ = empty_string_value;
  local_48.separator_ = separator;
  dVar1 = double_conversion::StringToDoubleConverter::StringToDouble
                    (&local_48,str16,length,processed_characters_count);
  *processed_all = *processed_characters_count == length;
  return dVar1;
}

Assistant:

static double StrToD16(const uc16* str16, int length, int flags,
                       double empty_string_value,
                       int* processed_characters_count, bool* processed_all,
                       uc16 separator = StringToDoubleConverter::kNoSeparator) {
  StringToDoubleConverter converter(flags, empty_string_value, Double::NaN(),
                                    NULL, NULL, separator);
  double result =
      converter.StringToDouble(str16, length, processed_characters_count);
  *processed_all = (length == *processed_characters_count);
  return result;
}